

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.hpp
# Opt level: O3

void __thiscall
gl4cts::EnhancedLayouts::VaryingStructureLocationsTest::~VaryingStructureLocationsTest
          (VaryingStructureLocationsTest *this)

{
  ~VaryingStructureLocationsTest(this);
  operator_delete(this,0xc0);
  return;
}

Assistant:

~VaryingStructureLocationsTest()
	{
	}